

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerEpoll.cpp
# Opt level: O2

void __thiscall Liby::PollerEpoll::PollerEpoll(PollerEpoll *this)

{
  int iVar1;
  Logger *this_00;
  int *piVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  __shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  Poller::Poller(&this->super_Poller);
  (this->super_Poller)._vptr_Poller = (_func_int **)&PTR__PollerEpoll_0012e480;
  this->pollerfd_ = -1;
  this->eventsSize_ = 0;
  (this->pollerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pollerfp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = epoll_create1(0x80000);
  this->pollerfd_ = iVar1;
  if (0 < iVar1) {
    std::make_shared<Liby::FileDescriptor,int&>((int *)&local_28);
    std::__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->pollerfp_).
                super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    std::vector<epoll_event,_std::allocator<epoll_event>_>::resize(&this->events_,0x30);
    return;
  }
  this_00 = Logger::getLogger();
  piVar2 = __errno_location();
  strerror(*piVar2);
  Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  exit(1);
}

Assistant:

PollerEpoll::PollerEpoll() {
    pollerfd_ = ::epoll_create1(EPOLL_CLOEXEC);
    fatalif(pollerfd_ <= 0, "%s", ::strerror(errno));
    pollerfp_ = std::make_shared<FileDescriptor>(pollerfd_);

    events_.resize(defaultEpollSize);
}